

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int update_script(int pi,uint script_id,uint numPar,uint32_t *param)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,0,
                             (gpioExtent_t *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_ESI);
  return iVar1;
}

Assistant:

int update_script(int pi, unsigned script_id, unsigned numPar, uint32_t *param)
{
   gpioExtent_t ext[1];

   /*
   p1=script id
   p2=0
   p3=numPar * 4
   ## extension ##
   uint32_t[numPar] pars
   */

   ext[0].size = 4 * numPar;
   ext[0].ptr = param;

   return pigpio_command_ext
      (pi, PI_CMD_PROCU, script_id, 0, numPar*4, 1, ext, 1);
}